

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseVersionSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte type;
  char cVar2;
  ushort uVar3;
  TreeModel *this_00;
  bool bVar4;
  UINT32 UVar5;
  USTATUS UVar6;
  ushort *puVar7;
  uint uVar8;
  UINT8 *ffsSize;
  UByteArray local_108;
  UByteArray header;
  UModelIndex parentVolumeIndex;
  CBString name;
  UByteArray body;
  CBString local_78;
  UModelIndex local_60;
  CBString info;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar4 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar4)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  }
  else {
    TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
    cVar2 = header.d._M_dataplus._M_p[0x19];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header.d._M_dataplus._M_p != &header.d.field_2) {
      operator_delete(header.d._M_dataplus._M_p);
    }
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar2 == '\x03') && (UVar5 = uint24ToUint32(ffsSize), UVar5 == 0xffffff)) {
      puVar7 = (ushort *)(ffsSize + 8);
      uVar8 = 10;
      goto LAB_00132d0f;
    }
  }
  puVar7 = (ushort *)(ffsSize + 4);
  uVar8 = 6;
LAB_00132d0f:
  UVar6 = 0x14;
  if (uVar8 <= (uint)(section->d)._M_string_length) {
    type = ffsSize[3];
    uVar3 = *puVar7;
    UByteArray::left(&header,section,uVar8);
    UByteArray::mid(&body,section,uVar8,-1);
    sectionTypeToUString((CBString *)&local_108,type);
    Bstrlib::CBString::operator+(&name,(CBString *)&local_108," section");
    Bstrlib::CBString::~CBString((CBString *)&local_108);
    uVar8 = (uint)(section->d)._M_string_length;
    usprintf(&info,
             "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nBuild number: %u"
             ,(ulong)type,(ulong)uVar8,(ulong)uVar8,(ulong)(uint)header.d._M_string_length,
             (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
             (ulong)(uint)body.d._M_string_length,(ulong)uVar3);
    if (insertIntoTree) {
      this_00 = this->model;
      Bstrlib::CBString::CBString(&local_78);
      paVar1 = &local_108.d.field_2;
      local_108.d._M_string_length = 0;
      local_108.d.field_2._M_local_buf[0] = '\0';
      local_108.d._M_dataplus._M_p = (pointer)paVar1;
      TreeModel::addItem(&local_60,this_00,localOffset,'C',type,&name,&local_78,&info,&header,&body,
                         &local_108,Movable,parent,'\0');
      index->m = local_60.m;
      index->r = local_60.r;
      index->c = local_60.c;
      index->i = local_60.i;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.d._M_dataplus._M_p != paVar1) {
        operator_delete(local_108.d._M_dataplus._M_p);
      }
      Bstrlib::CBString::~CBString(&local_78);
    }
    Bstrlib::CBString::~CBString(&info);
    Bstrlib::CBString::~CBString(&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)body.d._M_dataplus._M_p != &body.d.field_2) {
      operator_delete(body.d._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header.d._M_dataplus._M_p != &header.d.field_2) {
      operator_delete(header.d._M_dataplus._M_p);
    }
    UVar6 = 0;
  }
  return UVar6;
}

Assistant:

USTATUS FfsParser::parseVersionSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    UINT16 buildNumber;
    UINT8 type;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_VERSION_SECTION* versionHeader = (const EFI_VERSION_SECTION*)(section2Header + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_VERSION_SECTION);
        buildNumber = versionHeader->BuildNumber;
        type = section2Header->Type;
    }
    else { // Normal section
        const EFI_VERSION_SECTION* versionHeader = (const EFI_VERSION_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_VERSION_SECTION);
        buildNumber = versionHeader->BuildNumber;
        type = sectionHeader->Type;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + (" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nBuild number: %u",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size(),
                            buildNumber);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
    }
    
    return U_SUCCESS;
}